

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

void finish(svm_params *params)

{
  vw *pvVar1;
  char cVar2;
  ostream *poVar3;
  vw_ostream *pvVar4;
  
  free(params->pool);
  pvVar4 = &params->all->trace_message;
  std::__ostream_insert<char,std::char_traits<char>>(&pvVar4->super_ostream,"Num support = ",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar4);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pvVar4 = &params->all->trace_message;
  std::__ostream_insert<char,std::char_traits<char>>
            (&pvVar4->super_ostream,"Number of kernel evaluations = ",0x1f);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Number of cache queries = ",0x1a);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (&(params->all->trace_message).super_ostream,"Total loss = ",0xd);
  poVar3 = std::ostream::_M_insert<double>((double)params->loss_sum);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  free_svm_model(params->model);
  pvVar1 = params->all;
  pvVar4 = &pvVar1->trace_message;
  std::__ostream_insert<char,std::char_traits<char>>
            (&pvVar4->super_ostream,"Done freeing model",0x12);
  cVar2 = (char)pvVar4;
  std::ios::widen((char)(pvVar1->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (params->kernel_params != (void *)0x0) {
    free(params->kernel_params);
  }
  pvVar1 = params->all;
  pvVar4 = &pvVar1->trace_message;
  std::__ostream_insert<char,std::char_traits<char>>
            (&pvVar4->super_ostream,"Done freeing kernel params",0x1a);
  cVar2 = (char)pvVar4;
  std::ios::widen((char)(pvVar1->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  pvVar1 = params->all;
  pvVar4 = &pvVar1->trace_message;
  std::__ostream_insert<char,std::char_traits<char>>
            (&pvVar4->super_ostream,"Done with finish ",0x11);
  cVar2 = (char)pvVar4;
  std::ios::widen((char)(pvVar1->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void finish(svm_params& params)
{
  free(params.pool);

  params.all->trace_message << "Num support = " << params.model->num_support << endl;
  params.all->trace_message << "Number of kernel evaluations = " << num_kernel_evals << " "
                            << "Number of cache queries = " << num_cache_evals << endl;
  params.all->trace_message << "Total loss = " << params.loss_sum << endl;

  free_svm_model(params.model);
  params.all->trace_message << "Done freeing model" << endl;
  if (params.kernel_params)
    free(params.kernel_params);
  params.all->trace_message << "Done freeing kernel params" << endl;
  params.all->trace_message << "Done with finish " << endl;
}